

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void PackAndStore4_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *A,uint8_t *dst)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  undefined6 uVar15;
  undefined2 uVar16;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  __m128i RGBA_hi;
  __m128i RGBA_lo;
  __m128i ba;
  __m128i rg;
  __m128i ga;
  __m128i rb;
  uint8_t *dst_local;
  __m128i *A_local;
  __m128i *B_local;
  
  lVar1 = (*R)[0];
  lVar2 = (*R)[1];
  lVar3 = (*B)[0];
  lVar4 = (*B)[1];
  local_c8 = (short)lVar1;
  sStack_c6 = (short)((ulong)lVar1 >> 0x10);
  sStack_c4 = (short)((ulong)lVar1 >> 0x20);
  sStack_c2 = (short)((ulong)lVar1 >> 0x30);
  sStack_c0 = (short)lVar2;
  sStack_be = (short)((ulong)lVar2 >> 0x10);
  sStack_bc = (short)((ulong)lVar2 >> 0x20);
  sStack_ba = (short)((ulong)lVar2 >> 0x30);
  local_d8 = (short)lVar3;
  sStack_d6 = (short)((ulong)lVar3 >> 0x10);
  sStack_d4 = (short)((ulong)lVar3 >> 0x20);
  sStack_d2 = (short)((ulong)lVar3 >> 0x30);
  sStack_d0 = (short)lVar4;
  sStack_ce = (short)((ulong)lVar4 >> 0x10);
  sStack_cc = (short)((ulong)lVar4 >> 0x20);
  sStack_ca = (short)((ulong)lVar4 >> 0x30);
  lVar5 = (*G)[0];
  lVar6 = (*G)[1];
  lVar7 = (*A)[0];
  lVar8 = (*A)[1];
  local_e8 = (short)lVar5;
  sStack_e6 = (short)((ulong)lVar5 >> 0x10);
  sStack_e4 = (short)((ulong)lVar5 >> 0x20);
  sStack_e2 = (short)((ulong)lVar5 >> 0x30);
  sStack_e0 = (short)lVar6;
  sStack_de = (short)((ulong)lVar6 >> 0x10);
  sStack_dc = (short)((ulong)lVar6 >> 0x20);
  sStack_da = (short)((ulong)lVar6 >> 0x30);
  local_f8 = (short)lVar7;
  sStack_f6 = (short)((ulong)lVar7 >> 0x10);
  sStack_f4 = (short)((ulong)lVar7 >> 0x20);
  sStack_f2 = (short)((ulong)lVar7 >> 0x30);
  sStack_f0 = (short)lVar8;
  sStack_ee = (short)((ulong)lVar8 >> 0x10);
  sStack_ec = (short)((ulong)lVar8 >> 0x20);
  sStack_ea = (short)((ulong)lVar8 >> 0x30);
  uVar13 = CONCAT11((0 < local_e8) * (local_e8 < 0x100) * (char)lVar5 - (0xff < local_e8),
                    (0 < local_c8) * (local_c8 < 0x100) * (char)lVar1 - (0xff < local_c8));
  uVar14 = CONCAT13((0 < sStack_e6) * (sStack_e6 < 0x100) * (char)((ulong)lVar5 >> 0x10) -
                    (0xff < sStack_e6),
                    CONCAT12((0 < sStack_c6) * (sStack_c6 < 0x100) * (char)((ulong)lVar1 >> 0x10) -
                             (0xff < sStack_c6),uVar13));
  uVar15 = CONCAT15((0 < sStack_e4) * (sStack_e4 < 0x100) * (char)((ulong)lVar5 >> 0x20) -
                    (0xff < sStack_e4),
                    CONCAT14((0 < sStack_c4) * (sStack_c4 < 0x100) * (char)((ulong)lVar1 >> 0x20) -
                             (0xff < sStack_c4),uVar14));
  uVar9 = CONCAT11((0 < local_f8) * (local_f8 < 0x100) * (char)lVar7 - (0xff < local_f8),
                   (0 < local_d8) * (local_d8 < 0x100) * (char)lVar3 - (0xff < local_d8));
  uVar10 = CONCAT13((0 < sStack_f6) * (sStack_f6 < 0x100) * (char)((ulong)lVar7 >> 0x10) -
                    (0xff < sStack_f6),
                    CONCAT12((0 < sStack_d6) * (sStack_d6 < 0x100) * (char)((ulong)lVar3 >> 0x10) -
                             (0xff < sStack_d6),uVar9));
  uVar11 = CONCAT15((0 < sStack_f4) * (sStack_f4 < 0x100) * (char)((ulong)lVar7 >> 0x20) -
                    (0xff < sStack_f4),
                    CONCAT14((0 < sStack_d4) * (sStack_d4 < 0x100) * (char)((ulong)lVar3 >> 0x20) -
                             (0xff < sStack_d4),uVar10));
  RGBA_lo[1]._2_2_ = (undefined2)((uint)uVar14 >> 0x10);
  RGBA_lo[1]._4_2_ = (undefined2)((uint6)uVar15 >> 0x20);
  RGBA_lo[1]._6_2_ =
       (undefined2)
       (CONCAT17((0 < sStack_e2) * (sStack_e2 < 0x100) * (char)((ulong)lVar5 >> 0x30) -
                 (0xff < sStack_e2),
                 CONCAT16((0 < sStack_c2) * (sStack_c2 < 0x100) * (char)((ulong)lVar1 >> 0x30) -
                          (0xff < sStack_c2),uVar15)) >> 0x30);
  RGBA_hi[1]._2_2_ = (undefined2)((uint)uVar10 >> 0x10);
  RGBA_hi[1]._4_2_ = (undefined2)((uint6)uVar11 >> 0x20);
  RGBA_hi[1]._6_2_ =
       (undefined2)
       (CONCAT17((0 < sStack_f2) * (sStack_f2 < 0x100) * (char)((ulong)lVar7 >> 0x30) -
                 (0xff < sStack_f2),
                 CONCAT16((0 < sStack_d2) * (sStack_d2 < 0x100) * (char)((ulong)lVar3 >> 0x30) -
                          (0xff < sStack_d2),uVar11)) >> 0x30);
  uVar16 = CONCAT11((0 < sStack_e0) * (sStack_e0 < 0x100) * (char)lVar6 - (0xff < sStack_e0),
                    (0 < sStack_c0) * (sStack_c0 < 0x100) * (char)lVar2 - (0xff < sStack_c0));
  uVar14 = CONCAT13((0 < sStack_de) * (sStack_de < 0x100) * (char)((ulong)lVar6 >> 0x10) -
                    (0xff < sStack_de),
                    CONCAT12((0 < sStack_be) * (sStack_be < 0x100) * (char)((ulong)lVar2 >> 0x10) -
                             (0xff < sStack_be),uVar16));
  uVar15 = CONCAT15((0 < sStack_dc) * (sStack_dc < 0x100) * (char)((ulong)lVar6 >> 0x20) -
                    (0xff < sStack_dc),
                    CONCAT14((0 < sStack_bc) * (sStack_bc < 0x100) * (char)((ulong)lVar2 >> 0x20) -
                             (0xff < sStack_bc),uVar14));
  uVar12 = CONCAT11((0 < sStack_f0) * (sStack_f0 < 0x100) * (char)lVar8 - (0xff < sStack_f0),
                    (0 < sStack_d0) * (sStack_d0 < 0x100) * (char)lVar4 - (0xff < sStack_d0));
  uVar10 = CONCAT13((0 < sStack_ee) * (sStack_ee < 0x100) * (char)((ulong)lVar8 >> 0x10) -
                    (0xff < sStack_ee),
                    CONCAT12((0 < sStack_ce) * (sStack_ce < 0x100) * (char)((ulong)lVar4 >> 0x10) -
                             (0xff < sStack_ce),uVar12));
  uVar11 = CONCAT15((0 < sStack_ec) * (sStack_ec < 0x100) * (char)((ulong)lVar8 >> 0x20) -
                    (0xff < sStack_ec),
                    CONCAT14((0 < sStack_cc) * (sStack_cc < 0x100) * (char)((ulong)lVar4 >> 0x20) -
                             (0xff < sStack_cc),uVar10));
  ga[0]._2_2_ = (undefined2)((uint)uVar14 >> 0x10);
  ga[0]._4_2_ = (undefined2)((uint6)uVar15 >> 0x20);
  ga[0]._6_2_ = (undefined2)
                (CONCAT17((0 < sStack_da) * (sStack_da < 0x100) * (char)((ulong)lVar6 >> 0x30) -
                          (0xff < sStack_da),
                          CONCAT16((0 < sStack_ba) * (sStack_ba < 0x100) *
                                   (char)((ulong)lVar2 >> 0x30) - (0xff < sStack_ba),uVar15)) >>
                0x30);
  rg[0]._2_2_ = (undefined2)((uint)uVar10 >> 0x10);
  rg[0]._4_2_ = (undefined2)((uint6)uVar11 >> 0x20);
  rg[0]._6_2_ = (undefined2)
                (CONCAT17((0 < sStack_ea) * (sStack_ea < 0x100) * (char)((ulong)lVar8 >> 0x30) -
                          (0xff < sStack_ea),
                          CONCAT16((0 < sStack_ca) * (sStack_ca < 0x100) *
                                   (char)((ulong)lVar4 >> 0x30) - (0xff < sStack_ca),uVar11)) >>
                0x30);
  *(ulong *)dst = CONCAT26(RGBA_hi[1]._2_2_,CONCAT24(RGBA_lo[1]._2_2_,CONCAT22(uVar9,uVar13)));
  *(ulong *)(dst + 8) =
       CONCAT26(RGBA_hi[1]._6_2_,
                CONCAT24(RGBA_lo[1]._6_2_,CONCAT22(RGBA_hi[1]._4_2_,RGBA_lo[1]._4_2_)));
  *(ulong *)(dst + 0x10) = CONCAT26(rg[0]._2_2_,CONCAT24(ga[0]._2_2_,CONCAT22(uVar12,uVar16)));
  *(ulong *)(dst + 0x18) =
       CONCAT26(rg[0]._6_2_,CONCAT24(ga[0]._6_2_,CONCAT22(rg[0]._4_2_,ga[0]._4_2_)));
  return;
}

Assistant:

static WEBP_INLINE void PackAndStore4_SSE2(const __m128i* const R,
                                           const __m128i* const G,
                                           const __m128i* const B,
                                           const __m128i* const A,
                                           uint8_t* WEBP_RESTRICT const dst) {
  const __m128i rb = _mm_packus_epi16(*R, *B);
  const __m128i ga = _mm_packus_epi16(*G, *A);
  const __m128i rg = _mm_unpacklo_epi8(rb, ga);
  const __m128i ba = _mm_unpackhi_epi8(rb, ga);
  const __m128i RGBA_lo = _mm_unpacklo_epi16(rg, ba);
  const __m128i RGBA_hi = _mm_unpackhi_epi16(rg, ba);
  _mm_storeu_si128((__m128i*)(dst +  0), RGBA_lo);
  _mm_storeu_si128((__m128i*)(dst + 16), RGBA_hi);
}